

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Expected<llvm::DWARFDebugNames::Entry> * __thiscall
llvm::DWARFDebugNames::NameIndex::getEntry
          (Expected<llvm::DWARFDebugNames::Entry> *__return_storage_ptr__,NameIndex *this,
          uint64_t *Offset)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  long lVar4;
  FormParams FP;
  DWARFFormValue *this_00;
  DWARFDataExtractor *Data;
  const_iterator cVar5;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  undefined1 local_118 [8];
  Entry E;
  Error local_58;
  Error local_50;
  uint local_44;
  Error EStack_40;
  uint32_t AbbrevCode;
  Expected<llvm::DWARFDebugNames::Entry> *local_38;
  
  local_38 = __return_storage_ptr__;
  if (*Offset < (this->Section->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.
                Length) {
    Data = &(this->Section->super_DWARFAcceleratorTable).AccelSection;
    uVar2 = DataExtractor::getULEB128(&Data->super_DataExtractor,Offset,(Error *)0x0);
    local_44 = (uint)uVar2;
    if (local_44 == 0) {
      make_error<llvm::DWARFDebugNames::SentinelError>();
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_58);
      local_50.Payload = local_58.Payload;
    }
    else {
      cVar5 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
              ::find_as<unsigned_int>
                        ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                          *)this,&local_44);
      if (&(cVar5.Ptr)->key !=
          &(this->Abbrevs).
           super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
           .TheMap.Buckets
           [(this->Abbrevs).
            super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            .TheMap.NumBuckets].key) {
        DWARFDebugNames::Entry::Entry((Entry *)local_118,this,&(cVar5.Ptr)->key);
        FP.AddrSize = '\0';
        FP.Format = DWARF32;
        FP.Version = (this->Hdr).super_HeaderPOD.Version;
        lVar4 = (ulong)(uint)E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                             super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                             super_SmallVectorBase.BeginX * 0x30;
        this_00 = (DWARFFormValue *)E.super_Entry._vptr_Entry;
        do {
          if (lVar4 == 0) {
            Expected<llvm::DWARFDebugNames::Entry>::Expected<llvm::DWARFDebugNames::Entry>
                      (local_38,(Entry *)local_118,(type *)0x0);
            goto LAB_00d7674c;
          }
          bVar1 = DWARFFormValue::extractValue
                            (this_00,Data,Offset,FP,(DWARFContext *)0x0,(DWARFUnit *)0x0);
          this_00 = this_00 + 1;
          lVar4 = lVar4 + -0x30;
        } while (bVar1);
        pcVar3 = (char *)std::_V2::generic_category();
        EC._M_cat = (error_category *)0x5;
        EC._0_8_ = &stack0xffffffffffffffc0;
        createStringError(EC,pcVar3);
        Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&stack0xffffffffffffffc0);
        if ((long *)((ulong)EStack_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)EStack_40.Payload & 0xfffffffffffffffe) + 8))();
        }
LAB_00d7674c:
        DWARFAcceleratorTable::Entry::~Entry((Entry *)local_118);
        return local_38;
      }
      pcVar3 = (char *)std::_V2::generic_category();
      EC_01._M_cat = (error_category *)0x16;
      EC_01._0_8_ = &local_50;
      createStringError(EC_01,pcVar3);
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_50);
    }
  }
  else {
    pcVar3 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x54;
    EC_00._0_8_ = &E.Abbr;
    createStringError(EC_00,pcVar3);
    Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,(Error *)&E.Abbr);
    local_50.Payload = (ErrorInfoBase *)E.Abbr;
  }
  if ((long *)((ulong)local_50.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_50.Payload & 0xfffffffffffffffe) + 8))();
  }
  return local_38;
}

Assistant:

Expected<DWARFDebugNames::Entry>
DWARFDebugNames::NameIndex::getEntry(uint64_t *Offset) const {
  const DWARFDataExtractor &AS = Section.AccelSection;
  if (!AS.isValidOffset(*Offset))
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated entry list.");

  uint32_t AbbrevCode = AS.getULEB128(Offset);
  if (AbbrevCode == 0)
    return make_error<SentinelError>();

  const auto AbbrevIt = Abbrevs.find_as(AbbrevCode);
  if (AbbrevIt == Abbrevs.end())
    return createStringError(errc::invalid_argument, "Invalid abbreviation.");

  Entry E(*this, *AbbrevIt);

  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};
  for (auto &Value : E.Values) {
    if (!Value.extractValue(AS, Offset, FormParams))
      return createStringError(errc::io_error,
                               "Error extracting index attribute values.");
  }
  return std::move(E);
}